

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O0

TempVar * __thiscall
wasm::I64ToI32Lowering::fetchOutParam
          (TempVar *__return_storage_ptr__,I64ToI32Lowering *this,Expression *e)

{
  bool bVar1;
  pointer ppVar2;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>,_false>
  local_30;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>,_false>
  local_28;
  iterator outParamIt;
  Expression *e_local;
  I64ToI32Lowering *this_local;
  TempVar *ret;
  
  outParamIt.
  super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>,_false>
             )(_Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>,_false>
               )e;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Expression_*,_wasm::I64ToI32Lowering::TempVar,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>_>_>
       ::find(&this->highBitVars,(key_type *)&outParamIt);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Expression_*,_wasm::I64ToI32Lowering::TempVar,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>_>_>
       ::end(&this->highBitVars);
  bVar1 = std::__detail::operator!=(&local_28,&local_30);
  if (bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>,_false,_false>
             ::operator->((_Node_iterator<std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>,_false,_false>
                           *)&local_28);
    TempVar::TempVar(__return_storage_ptr__,&ppVar2->second);
    std::
    unordered_map<wasm::Expression_*,_wasm::I64ToI32Lowering::TempVar,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>_>_>
    ::erase(&this->highBitVars,(key_type *)&outParamIt);
    return __return_storage_ptr__;
  }
  __assert_fail("outParamIt != highBitVars.end()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                ,0x668,"TempVar wasm::I64ToI32Lowering::fetchOutParam(Expression *)");
}

Assistant:

TempVar fetchOutParam(Expression* e) {
    auto outParamIt = highBitVars.find(e);
    assert(outParamIt != highBitVars.end());
    TempVar ret = std::move(outParamIt->second);
    highBitVars.erase(e);
    return ret;
  }